

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ClearTest::iterate(ClearTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  int iVar67;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar68;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar70;
  float afStack_98 [2];
  GLfloat reference_7 [4];
  unsigned_short local_80 [4];
  GLhalf reference_6 [4];
  GLint reference_5 [4];
  GLuint reference_4 [4];
  GLshort reference_3 [4];
  GLushort reference_2 [4];
  uchar local_40 [4];
  GLbyte reference_1 [4];
  GLubyte reference [4];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  ClearTest *this_local;
  long lVar69;
  
  pRVar68 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar67 = (*pRVar68->_vptr_RenderContext[3])();
  lVar69 = CONCAT44(extraout_var,iVar67);
  pRVar68 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar68->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lVar69 + 0xec0);
    this->m_pClearNamedBufferData = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar69 + 0x1d8);
    this->m_pClearNamedBufferSubData = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar69 + 0x1e0);
    if ((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0) ||
       ((this->m_pClearNamedBufferData == (PFNGLCLEARNAMEDBUFFERDATA)0x0 ||
        (this->m_pClearNamedBufferSubData == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0)))) {
      puVar70 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar70 = 0;
      __cxa_throw(puVar70,&int::typeinfo,0);
    }
    builtin_memcpy(local_40,"\x05\x01\x02\x03",4);
    bVar1 = TestClearNamedBufferData<unsigned_char,false>(this,0x8229,1,0x1903,0x1401,local_40);
    bVar2 = TestClearNamedBufferData<unsigned_char,false>(this,0x822b,2,0x8227,0x1401,local_40);
    bVar3 = TestClearNamedBufferData<unsigned_char,false>(this,0x8058,4,0x1908,0x1401,local_40);
    bVar4 = TestClearNamedBufferData<unsigned_char,true>(this,0x8229,1,0x1903,0x1401,local_40);
    bVar5 = TestClearNamedBufferData<unsigned_char,true>(this,0x822b,2,0x8227,0x1401,local_40);
    bVar6 = TestClearNamedBufferData<unsigned_char,true>(this,0x8058,4,0x1908,0x1401,local_40);
    bVar7 = TestClearNamedBufferData<unsigned_char,false>(this,0x8232,1,0x1903,0x1401,local_40);
    bVar8 = TestClearNamedBufferData<unsigned_char,false>(this,0x8238,2,0x8227,0x1401,local_40);
    bVar9 = TestClearNamedBufferData<unsigned_char,false>(this,0x8d7c,4,0x1908,0x1401,local_40);
    bVar10 = TestClearNamedBufferData<unsigned_char,true>(this,0x8232,1,0x1903,0x1401,local_40);
    bVar11 = TestClearNamedBufferData<unsigned_char,true>(this,0x8238,2,0x8227,0x1401,local_40);
    bVar12 = TestClearNamedBufferData<unsigned_char,true>(this,0x8d7c,4,0x1908,0x1401,local_40);
    reference_2[2] = 0x105;
    reference_2[3] = 0x3fe;
    bVar13 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8231,1,0x1903,0x1400,(char *)(reference_2 + 2));
    bVar14 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8237,2,0x8227,0x1400,(char *)(reference_2 + 2));
    bVar15 = TestClearNamedBufferData<signed_char,false>
                       (this,0x8d8e,4,0x1908,0x1400,(char *)(reference_2 + 2));
    bVar16 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8231,1,0x1903,0x1400,(char *)(reference_2 + 2));
    bVar17 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8237,2,0x8227,0x1400,(char *)(reference_2 + 2));
    bVar18 = TestClearNamedBufferData<signed_char,true>
                       (this,0x8d8e,4,0x1908,0x1400,(char *)(reference_2 + 2));
    reference_3[0] = 5;
    reference_3[1] = 1;
    reference_3[2] = 2;
    reference_3[3] = 3;
    bVar19 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822a,1,0x1903,0x1403,(unsigned_short *)reference_3);
    bVar20 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x822c,2,0x8227,0x1403,(unsigned_short *)reference_3);
    bVar21 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x805b,4,0x1908,0x1403,(unsigned_short *)reference_3);
    bVar22 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822a,1,0x1903,0x1403,(unsigned_short *)reference_3);
    bVar23 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x822c,2,0x8227,0x1403,(unsigned_short *)reference_3);
    bVar24 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x805b,4,0x1908,0x1403,(unsigned_short *)reference_3);
    bVar25 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x8234,1,0x1903,0x1403,(unsigned_short *)reference_3);
    bVar26 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x823a,2,0x8227,0x1403,(unsigned_short *)reference_3);
    bVar27 = TestClearNamedBufferData<unsigned_short,false>
                       (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)reference_3);
    bVar28 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x8234,1,0x1903,0x1403,(unsigned_short *)reference_3);
    bVar29 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x823a,2,0x8227,0x1403,(unsigned_short *)reference_3);
    bVar30 = TestClearNamedBufferData<unsigned_short,true>
                       (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)reference_3);
    reference_4[2] = 0x10005;
    reference_4[3] = 0x3fffe;
    bVar31 = TestClearNamedBufferData<short,false>
                       (this,0x8233,1,0x1903,0x1402,(short *)(reference_4 + 2));
    bVar32 = TestClearNamedBufferData<short,false>
                       (this,0x8239,2,0x8227,0x1402,(short *)(reference_4 + 2));
    bVar33 = TestClearNamedBufferData<short,false>
                       (this,0x8d88,4,0x1908,0x1402,(short *)(reference_4 + 2));
    bVar34 = TestClearNamedBufferData<short,true>
                       (this,0x8233,1,0x1903,0x1402,(short *)(reference_4 + 2));
    bVar35 = TestClearNamedBufferData<short,true>
                       (this,0x8239,2,0x8227,0x1402,(short *)(reference_4 + 2));
    bVar36 = TestClearNamedBufferData<short,true>
                       (this,0x8d88,4,0x1908,0x1402,(short *)(reference_4 + 2));
    reference_5[2] = 5;
    reference_5[3] = 1;
    reference_4[0] = 2;
    reference_4[1] = 3;
    bVar37 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8236,1,0x1903,0x1405,(uint *)(reference_5 + 2));
    bVar38 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x823c,2,0x8227,0x1405,(uint *)(reference_5 + 2));
    bVar39 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8d71,3,0x1907,0x1405,(uint *)(reference_5 + 2));
    bVar40 = TestClearNamedBufferData<unsigned_int,false>
                       (this,0x8d70,4,0x1908,0x1405,(uint *)(reference_5 + 2));
    bVar41 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8236,1,0x1903,0x1405,(uint *)(reference_5 + 2));
    bVar42 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x823c,2,0x8227,0x1405,(uint *)(reference_5 + 2));
    bVar43 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8d71,3,0x1907,0x1405,(uint *)(reference_5 + 2));
    bVar44 = TestClearNamedBufferData<unsigned_int,true>
                       (this,0x8d70,4,0x1908,0x1405,(uint *)(reference_5 + 2));
    reference_6[0] = 5;
    reference_6[1] = 0;
    reference_6[2] = 1;
    reference_6[3] = 0;
    reference_5[0] = -2;
    reference_5[1] = 3;
    bVar45 = TestClearNamedBufferData<int,false>(this,0x8235,1,0x1903,0x1404,(int *)reference_6);
    bVar46 = TestClearNamedBufferData<int,false>(this,0x823b,2,0x8227,0x1404,(int *)reference_6);
    bVar47 = TestClearNamedBufferData<int,false>(this,0x8d83,3,0x1907,0x1404,(int *)reference_6);
    bVar48 = TestClearNamedBufferData<int,false>(this,0x8d82,4,0x1908,0x1404,(int *)reference_6);
    bVar49 = TestClearNamedBufferData<int,true>(this,0x8235,1,0x1903,0x1404,(int *)reference_6);
    bVar50 = TestClearNamedBufferData<int,true>(this,0x823b,2,0x8227,0x1404,(int *)reference_6);
    bVar51 = TestClearNamedBufferData<int,true>(this,0x8d83,3,0x1907,0x1404,(int *)reference_6);
    bVar52 = TestClearNamedBufferData<int,true>(this,0x8d82,4,0x1908,0x1404,(int *)reference_6);
    local_80[0] = 0x3c00;
    local_80[1] = 0;
    local_80[2] = 0xc000;
    local_80[3] = 0x3555;
    bVar53 = TestClearNamedBufferData<unsigned_short,false>(this,0x822d,1,0x1903,0x140b,local_80);
    bVar54 = TestClearNamedBufferData<unsigned_short,false>(this,0x822f,2,0x8227,0x140b,local_80);
    bVar55 = TestClearNamedBufferData<unsigned_short,false>(this,0x881a,4,0x1908,0x140b,local_80);
    bVar56 = TestClearNamedBufferData<unsigned_short,true>(this,0x822d,1,0x1903,0x140b,local_80);
    bVar57 = TestClearNamedBufferData<unsigned_short,true>(this,0x822f,2,0x8227,0x140b,local_80);
    bVar58 = TestClearNamedBufferData<unsigned_short,true>(this,0x881a,4,0x1908,0x140b,local_80);
    afStack_98[0] = 1.0;
    afStack_98[1] = 0.0;
    reference_7[0] = -2.0;
    reference_7[1] = 0.33333334;
    bVar59 = TestClearNamedBufferData<float,false>(this,0x822e,1,0x1903,0x1406,afStack_98);
    bVar60 = TestClearNamedBufferData<float,false>(this,0x8230,2,0x8227,0x1406,afStack_98);
    bVar61 = TestClearNamedBufferData<float,false>(this,0x8815,3,0x1907,0x1406,afStack_98);
    bVar62 = TestClearNamedBufferData<float,false>(this,0x8814,4,0x1908,0x1406,afStack_98);
    bVar63 = TestClearNamedBufferData<float,true>(this,0x822e,1,0x1903,0x1406,afStack_98);
    bVar64 = TestClearNamedBufferData<float,true>(this,0x8230,2,0x8227,0x1406,afStack_98);
    bVar65 = TestClearNamedBufferData<float,true>(this,0x8815,3,0x1907,0x1406,afStack_98);
    bVar66 = TestClearNamedBufferData<float,true>(this,0x8814,4,0x1908,0x1406,afStack_98);
    do {
      iVar67 = (**(code **)(lVar69 + 0x800))();
    } while (iVar67 != 0);
    if ((bVar65 &&
        (bVar64 &&
        (bVar63 &&
        (bVar62 &&
        (bVar61 &&
        (bVar60 &&
        (bVar59 &&
        (bVar58 &&
        (bVar57 &&
        (bVar56 &&
        (bVar55 &&
        (bVar54 &&
        (bVar53 &&
        (bVar52 &&
        (bVar51 &&
        (bVar50 &&
        (bVar49 &&
        (bVar48 &&
        (bVar47 &&
        (bVar46 &&
        (bVar45 &&
        (bVar44 &&
        (bVar43 &&
        (bVar42 &&
        (bVar41 &&
        (bVar40 &&
        (bVar39 &&
        (bVar38 &&
        (bVar37 &&
        (bVar36 &&
        (bVar35 &&
        (bVar34 &&
        (bVar33 &&
        (bVar32 &&
        (bVar31 &&
        (bVar30 &&
        (bVar29 &&
        (bVar28 &&
        (bVar27 &&
        (bVar26 &&
        (bVar25 &&
        (bVar24 &&
        (bVar23 &&
        (bVar22 &&
        (bVar21 &&
        (bVar20 &&
        (bVar19 &&
        (bVar18 &&
        (bVar17 &&
        (bVar16 &&
        (bVar15 &&
        (bVar14 &&
        (bVar13 &&
        (bVar12 &&
        (bVar11 &&
        (bVar10 &&
        (bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && (bVar2 && bVar1)))))))
        ))))))))))))))))))))))))))))))))))))))))))))))))))))))))) && bVar66) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ClearTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	m_pNamedBufferData		   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pClearNamedBufferData	= (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pClearNamedBufferData) ||
			(DE_NULL == m_pClearNamedBufferSubData))
		{
			throw 0;
		}

		{
			/* unsigned byte norm component ClearNamedBufferData tests */
			glw::GLubyte reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);
		}

		{
			/* signed byte component ClearNamedBufferData tests */
			glw::GLbyte reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);

			/* signed byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);
		}

		{
			/* unsigned short norm component ClearNamedBufferData tests */
			glw::GLushort reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);
		}

		{
			/* signed short component ClearNamedBufferData tests */
			glw::GLshort reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);

			/* signed short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);
		}

		{
			/* unsigned int component ClearNamedBufferData tests */
			glw::GLuint reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);

			/* unsigned int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);
		}

		{
			/* signed int component ClearNamedBufferData tests */
			glw::GLint reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);

			/* signed int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);
		}

		{
			/* half float component ClearNamedBufferData tests */
			glw::GLhalf reference[4] = { 0x3C00 /* 1.0hf */, 0x0000 /* 0.0hf */, 0xC000 /* -2.0hf */,
										 0x3555 /* 0.333333333hf */ };

			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);

			/* half float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);
		}

		{
			/* float component ClearNamedBufferData tests */
			glw::GLfloat reference[4] = { 1.f, 0.f, -2.f, 0.3333333333f };

			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);

			/* float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}